

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
          (ShaderImageLoadStoreBase *this,vec4 *v0,vec4 *v1,GLenum internalformat)

{
  float fVar1;
  float *pfVar2;
  bool local_79;
  Vector<float,_4> local_4c;
  Vector<float,_4> local_3c;
  GLenum local_2c;
  vec4 *pvStack_28;
  GLenum internalformat_local;
  vec4 *v1_local;
  vec4 *v0_local;
  ShaderImageLoadStoreBase *this_local;
  
  local_2c = internalformat;
  pvStack_28 = v1;
  v1_local = v0;
  v0_local = (vec4 *)this;
  if (((internalformat == 0x8f9b) || (internalformat == 0x8f99)) || (internalformat == 0x8f98)) {
    tcu::Vector<float,_4>::Vector(&local_3c,0.0001);
    this_local._7_1_ = ColorEqual(this,v0,v1,&local_3c);
  }
  else if (((internalformat == 0x8f97) || (internalformat == 0x8f95)) || (internalformat == 0x8f94))
  {
    tcu::Vector<float,_4>::Vector(&local_4c,0.01);
    this_local._7_1_ = ColorEqual(this,v0,v1,&local_4c);
  }
  else {
    pfVar2 = tcu::Vector<float,_4>::operator[](v0,0);
    fVar1 = *pfVar2;
    pfVar2 = tcu::Vector<float,_4>::operator[](pvStack_28,0);
    local_79 = false;
    if ((fVar1 == *pfVar2) && (!NAN(fVar1) && !NAN(*pfVar2))) {
      pfVar2 = tcu::Vector<float,_4>::operator[](v1_local,1);
      fVar1 = *pfVar2;
      pfVar2 = tcu::Vector<float,_4>::operator[](pvStack_28,1);
      local_79 = false;
      if ((fVar1 == *pfVar2) && (!NAN(fVar1) && !NAN(*pfVar2))) {
        pfVar2 = tcu::Vector<float,_4>::operator[](v1_local,2);
        fVar1 = *pfVar2;
        pfVar2 = tcu::Vector<float,_4>::operator[](pvStack_28,2);
        local_79 = false;
        if ((fVar1 == *pfVar2) && (!NAN(fVar1) && !NAN(*pfVar2))) {
          pfVar2 = tcu::Vector<float,_4>::operator[](v1_local,3);
          fVar1 = *pfVar2;
          pfVar2 = tcu::Vector<float,_4>::operator[](pvStack_28,3);
          local_79 = fVar1 == *pfVar2;
        }
      }
    }
    this_local._7_1_ = local_79;
  }
  return this_local._7_1_;
}

Assistant:

bool Equal(const vec4& v0, const vec4& v1, GLenum internalformat)
	{
		if (internalformat == GL_RGBA16_SNORM || internalformat == GL_RG16_SNORM || internalformat == GL_R16_SNORM)
		{
			return ColorEqual(v0, v1, vec4(0.0001f));
		}
		else if (internalformat == GL_RGBA8_SNORM || internalformat == GL_RG8_SNORM || internalformat == GL_R8_SNORM)
		{
			return ColorEqual(v0, v1, vec4(0.01f));
		}
		return (v0[0] == v1[0]) && (v0[1] == v1[1]) && (v0[2] == v1[2]) && (v0[3] == v1[3]);
	}